

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_load_standard_env(sexp ctx,sexp e,sexp version)

{
  undefined1 auVar1 [16];
  sexp out;
  undefined8 uVar2;
  sexp psVar3;
  sexp param;
  sexp_conflict *in_RDX;
  sexp in_RSI;
  sexp in_RDI;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp sym;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp op;
  char init_file [128];
  int len;
  sexp tail;
  sexp in_stack_fffffffffffffeb0;
  sexp in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  sexp in_stack_fffffffffffffed0;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 n;
  undefined1 local_f0 [8];
  undefined8 len_00;
  undefined8 uVar6;
  undefined8 ctx_00;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined4 local_1c;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_b0 = 0x43e;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_c8 + 8,0,0x10);
  local_c8._0_8_ = 0x43e;
  memset(&stack0xffffffffffffff28,0,0x10);
  uVar6 = &DAT_0000043e;
  memset(local_f0,0,0x10);
  local_c8._8_8_ = &stack0xffffffffffffff50;
  local_c8._16_8_ = *(sexp_conflict *)(local_8 + 0x6080);
  *(sexp_conflict *)(local_8 + 0x6080) = (sexp_conflict)(local_c8 + 8);
  ctx_00 = local_c8;
  *(sexp_conflict *)(local_8 + 0x6080) = (sexp_conflict)&stack0xffffffffffffff28;
  local_f0 = (undefined1  [8])&stack0xffffffffffffff20;
  len_00 = *(sexp_conflict *)(local_8 + 0x6080);
  *(sexp_conflict *)(local_8 + 0x6080) = (sexp_conflict)local_f0;
  if ((sexp)local_10 == (sexp)0x0) {
    local_10 = *(sexp_conflict *)(local_8 + 0x10);
  }
  uVar4 = local_8;
  uVar5 = local_10;
  out = sexp_intern((sexp)ctx_00,(char *)uVar6,len_00);
  uVar2 = out;
  local_c8._0_8_ =
       sexp_c_string((sexp)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                     (sexp_sint_t)in_stack_fffffffffffffeb8);
  sexp_env_define((sexp)uVar4,in_stack_fffffffffffffed0,(sexp)in_stack_fffffffffffffec8,
                  (sexp)in_stack_fffffffffffffec0);
  uVar6 = local_8;
  n = local_10;
  uVar2 = sexp_intern((sexp)ctx_00,(char *)uVar2,len_00);
  sexp_env_define((sexp)uVar4,in_stack_fffffffffffffed0,(sexp)in_stack_fffffffffffffec8,
                  (sexp)in_stack_fffffffffffffec0);
  ((*(sexp_conflict *)(local_8 + 0x28))->value).opcode.dl = (sexp)0x23e;
  tail = (sexp)&DAT_0000043e;
  local_b0 = sexp_make_foreign((sexp)uVar5,(char *)uVar4,
                               (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                               (int)in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,
                               (sexp_proc1)in_stack_fffffffffffffec0,(sexp)uVar6);
  local_c8._0_8_ =
       sexp_cons_op((sexp)in_stack_fffffffffffffec8,(sexp)in_stack_fffffffffffffec0,
                    (sexp_sint_t)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,tail);
  sexp_push_op(in_stack_fffffffffffffeb8,(sexp_conflict *)in_stack_fffffffffffffeb0,tail);
  uVar4 = local_8;
  uVar5 = local_10;
  uVar2 = sexp_intern((sexp)ctx_00,(char *)uVar2,len_00);
  psVar3 = sexp_env_ref(in_stack_fffffffffffffed0,(sexp)in_stack_fffffffffffffec8,
                        (sexp)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  ((*(sexp_conflict *)(local_8 + 0x28))->value).context.mark_stack[4].prev =
       (sexp_mark_stack_ptr_t *)psVar3;
  local_1c = 5;
  strncpy(&stack0xffffffffffffff58,"init-",6);
  auVar1._8_8_ = (long)local_18 >> 0x3f;
  auVar1._0_8_ = local_18 & 0xfffffffffffffffe;
  (&stack0xffffffffffffff58)[(int)local_1c] = SUB161(auVar1 / SEXT816(2),0) + '0';
  strncpy(&stack0xffffffffffffff59 + (int)local_1c,".scm",5);
  (&stack0xffffffffffffff5c)[local_1c + 1] = 0;
  local_c8._0_8_ =
       sexp_load_module_file
                 (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,
                  (sexp)in_stack_fffffffffffffec0);
  sexp_set_parameter((sexp)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                     in_stack_fffffffffffffeb0,tail);
  if (((local_c8._0_8_ & 3) != 0) || (*(sexp_tag_t *)local_c8._0_8_ != 0x13)) {
    local_c8._0_8_ = ((*(sexp_conflict *)(local_8 + 0x28))->value).opcode.func;
    if ((((local_c8._0_8_ & 3) != 0) ||
        (local_c8._0_8_ = ((*(sexp_conflict *)(local_8 + 0x28))->value).context.dl,
        ((sexp)local_c8._0_8_)->tag != 0x17)) &&
       ((local_c8._0_8_ =
              sexp_make_env_op((sexp)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                               (sexp_sint_t)in_stack_fffffffffffffeb0), (local_c8._0_8_ & 3) != 0 ||
        (((sexp)local_c8._0_8_)->tag != 0x13)))) {
      ((*(sexp_conflict *)(local_8 + 0x28))->value).context.dl = (sexp)local_c8._0_8_;
      (((sexp)local_c8._0_8_)->value).flonum = (double)local_10;
      psVar3 = sexp_load_module_file
                         (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,
                          (sexp)in_stack_fffffffffffffec0);
      local_b0 = psVar3;
      if ((((ulong)psVar3 & 3) == 0) && (psVar3->tag == 0x13)) {
        in_stack_fffffffffffffec0 = local_8;
        in_stack_fffffffffffffec8 = local_8;
        param = sexp_env_ref(psVar3,(sexp)local_8,(sexp)local_8,in_stack_fffffffffffffeb8);
        sexp_parameter_ref((sexp)in_stack_fffffffffffffec0,param);
        sexp_print_exception_op((sexp)uVar5,(sexp)uVar4,n,(sexp)uVar6,out);
        in_stack_fffffffffffffed0 = psVar3;
      }
    }
    if (((local_c8._0_8_ & 3) != 0) || (*(sexp_tag_t *)local_c8._0_8_ != 0x13)) {
      uVar6 = sexp_intern((sexp)ctx_00,(char *)uVar2,len_00);
      local_c8._0_8_ =
           sexp_env_ref(in_stack_fffffffffffffed0,(sexp)in_stack_fffffffffffffec8,
                        (sexp)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      sexp_intern((sexp)ctx_00,(char *)uVar6,len_00);
      local_c8._0_8_ =
           sexp_cons_op((sexp)in_stack_fffffffffffffec8,(sexp)in_stack_fffffffffffffec0,
                        (sexp_sint_t)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,tail);
      (((sexp)local_c8._0_8_)->value).type.slots =
           ((sexp_mark_stack_ptr_t *)(local_10 + 0x18))->start[3];
      ((sexp_mark_stack_ptr_t *)(local_10 + 0x18))->start[3] = (sexp_conflict)local_c8._0_8_;
    }
  }
  *(undefined8 *)(local_8 + 0x6080) = local_c8._16_8_;
  if (((local_c8._0_8_ & 3) == 0) && (*(sexp_tag_t *)local_c8._0_8_ == 0x13)) {
    local_10 = local_c8._0_8_;
  }
  return (sexp)local_10;
}

Assistant:

sexp sexp_load_standard_env (sexp ctx, sexp e, sexp version) {
  int len;
  char init_file[128];
  sexp_gc_var3(op, tmp, sym);
  sexp_gc_preserve3(ctx, op, tmp, sym);
  if (!e) e = sexp_context_env(ctx);
  sexp_env_define(ctx, e, sym=sexp_intern(ctx, "*shared-object-extension*", -1),
                  tmp=sexp_c_string(ctx, sexp_so_extension, -1));
  sexp_env_define(ctx, e, sym=sexp_intern(ctx, "*features*", -1), sexp_global(ctx, SEXP_G_FEATURES));
  sexp_global(ctx, SEXP_G_OPTIMIZATIONS) = SEXP_NULL;
#if SEXP_USE_SIMPLIFY
  op = sexp_make_foreign(ctx, "sexp_simplify", 1, 0,
                         NULL, (sexp_proc1)sexp_simplify, SEXP_VOID);
  tmp = sexp_cons(ctx, sexp_make_fixnum(500), op);
  sexp_push(ctx, sexp_global(ctx, SEXP_G_OPTIMIZATIONS), tmp);
#endif
  sexp_global(ctx, SEXP_G_ERR_HANDLER)
    = sexp_env_ref(ctx, e, sym=sexp_intern(ctx, "current-exception-handler", -1), SEXP_FALSE);
  /* load init-7.scm */
  len = strlen(sexp_init_file);
  strncpy(init_file, sexp_init_file, len+1);
  init_file[len] = (char)sexp_unbox_fixnum(version) + '0';
  strncpy(init_file + len + 1, sexp_init_file_suffix, strlen(sexp_init_file_suffix)+1);
  init_file[len + 1 + strlen(sexp_init_file_suffix)] = 0;
  tmp = sexp_load_module_file(ctx, init_file, e);
  sexp_set_parameter(ctx, e, sexp_global(ctx, SEXP_G_INTERACTION_ENV_SYMBOL), e);
  /* load and bind meta-7.scm env */
#if SEXP_USE_MODULES
  if (!sexp_exceptionp(tmp)) {
    if (!sexp_envp(tmp=sexp_global(ctx, SEXP_G_META_ENV))) {
      tmp = sexp_make_env(ctx);
      if (! sexp_exceptionp(tmp)) {
        sexp_global(ctx, SEXP_G_META_ENV) = tmp;
        sexp_env_parent(tmp) = e;
        op = sexp_load_module_file(ctx, sexp_meta_file, tmp);
        if (sexp_exceptionp(op))
          sexp_print_exception(ctx, op, sexp_current_error_port(ctx));
      }
    }
    if (!sexp_exceptionp(tmp)) {
      sym = sexp_intern(ctx, "repl-import", -1);
      tmp = sexp_env_ref(ctx, tmp, sym, SEXP_VOID);
      sym = sexp_intern(ctx, "import", -1);
      /* splice import in place to mutate both this env and the */
      /* frozen version in the meta env) */
      tmp = sexp_cons(ctx, sym, tmp);
      sexp_env_next_cell(tmp) = sexp_env_next_cell(sexp_env_bindings(e));
      sexp_env_next_cell(sexp_env_bindings(e)) = tmp;
    }
  }
#endif
  sexp_gc_release3(ctx);
  return sexp_exceptionp(tmp) ? tmp : e;
}